

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O1

void __thiscall rudp::session::update_receive_head(session *this,outiter_t *received)

{
  uint8_t *puVar1;
  byte bVar2;
  element_type *peVar3;
  ulong uVar4;
  array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL> *u;
  uint uVar5;
  uint8_t uVar6;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *psVar7;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *psVar8;
  array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
  *paVar9;
  int iVar10;
  iterator head_iter;
  shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *psVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  uint local_34;
  
  puVar1 = &this->receive_head;
  bVar2 = this->receive_head;
  psVar11 = (this->receive_buffer)._M_elems + bVar2;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  psVar7 = std::
           __find_if<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>*,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>const>>
                     (psVar11,puVar1);
  psVar8 = psVar11;
  local_34 = (uint)bVar2;
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  for (; psVar8 != psVar7; psVar8 = psVar8 + 1) {
    peVar3 = (psVar8->
             super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
             )._M_ptr;
    if (((peVar3 != (element_type *)0x0) &&
        (uVar4 = (peVar3->
                 super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                 ).m_holder.m_size, 2 < uVar4)) &&
       (*(uchar *)((long)(peVar3->
                         super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                         ).m_holder.super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>
                         .storage.aligner.data + 1) < uVar4)) {
      boost::container::
      vector<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,boost::container::dtl::static_storage_allocator<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,256ul,0ul,true>,void>
      ::
      priv_push_back<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>const&>
                ((vector<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,boost::container::dtl::static_storage_allocator<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,256ul,0ul,true>,void>
                  *)received->container,psVar8);
    }
  }
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (psVar11 != psVar7) {
    do {
      (psVar11->
      super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(psVar11->
                  super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                  )._M_refcount,&_Stack_40);
      psVar11 = psVar11 + 1;
    } while (psVar11 != psVar7);
  }
  paVar9 = &this->receive_buffer;
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
  }
  uVar5 = local_34;
  iVar10 = (int)paVar9;
  this->receive_head = (uint8_t)((uint)((int)psVar7 - iVar10) >> 4);
  if (psVar7 == (shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_> *)puVar1)
  {
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    psVar8 = std::
             __find_if<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>*,__gnu_cxx::__ops::_Iter_equals_val<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>const>>
                       (paVar9,puVar1);
    u = paVar9;
    if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
    }
    for (; u != (array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
                 *)psVar8;
        u = (array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
             *)(&u->_M_elems[0].
                 super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
               + 1)) {
      peVar3 = u->_M_elems[0].
               super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
      if (((peVar3 != (element_type *)0x0) &&
          (uVar4 = (peVar3->
                   super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                   ).m_holder.m_size, 2 < uVar4)) &&
         (*(uchar *)((long)(peVar3->
                           super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                           ).m_holder.
                           super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.storage.
                           aligner.data + 1) < uVar4)) {
        boost::container::
        vector<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,boost::container::dtl::static_storage_allocator<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,256ul,0ul,true>,void>
        ::
        priv_push_back<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>const&>
                  ((vector<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,boost::container::dtl::static_storage_allocator<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,256ul,0ul,true>,void>
                    *)received->container,u->_M_elems);
      }
    }
    _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (paVar9 != (array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
                   *)psVar8) {
      do {
        paVar9->_M_elems[0].
        super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&paVar9->_M_elems[0].
                    super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,&_Stack_40);
        paVar9 = (array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
                  *)(&paVar9->_M_elems[0].
                      super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                    + 1);
      } while (paVar9 != (array<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL>
                          *)psVar8);
    }
    if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
    }
    this->receive_head = (uint8_t)((uint)((int)psVar8 - iVar10) >> 4);
  }
  uVar6 = this->out_of_sequence_count + '\x01';
  if ((uint8_t)uVar5 != this->receive_head) {
    uVar6 = '\0';
  }
  this->out_of_sequence_count = uVar6;
  return;
}

Assistant:

void session::update_receive_head( outiter_t &received ) {
    const auto old_receive_head = receive_head;
    const auto head_iter = std::next( receive_buffer.begin(), receive_head );
    const auto end_iter = std::find( head_iter, receive_buffer.end(), buffer_ptr_t() );
    for( auto iter = head_iter; iter != end_iter; ++iter ) {
      if( iter && *iter && (*iter)->size() > 2 && (*iter)->size() > (**iter)[ 1 ] ) {
        *received = *iter;
	       ++received;
      }
    }
    std::fill( head_iter, end_iter, buffer_ptr_t() );
    receive_head = std::distance( receive_buffer.begin(), end_iter );
    if( end_iter == receive_buffer.end() ) {
      const auto head_iter = receive_buffer.begin();
      const auto end_iter = std::find( head_iter, receive_buffer.end(), buffer_ptr_t() );
      for( auto iter = head_iter; iter != end_iter; ++iter ) {
        if( iter && *iter && (*iter)->size() > 2 && (*iter)->size() > (**iter)[ 1 ] ) {
          *received = *iter;
          ++received;
        }
      }
      std::fill( head_iter, end_iter, buffer_ptr_t() );
      receive_head = std::distance( receive_buffer.begin(), end_iter );
    }
    if( old_receive_head == receive_head ) ++out_of_sequence_count;
    else out_of_sequence_count = 0;
  }